

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O2

Header * readJPG(string *filename)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  ostream *poVar4;
  Header *this;
  uint uVar5;
  Header *header;
  long lVar6;
  char *pcVar7;
  uint uVar8;
  byte last;
  ifstream inFile;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&inFile,(string *)filename,_S_in|_S_bin);
  if ((abStack_218[*(long *)(_inFile + -0x18)] & 5) == 0) {
    header = (Header *)&std::nothrow;
    this = (Header *)operator_new(0x1e70,(nothrow_t *)&std::nothrow);
    if (this != (Header *)0x0) {
      Header::Header(this);
      last = std::istream::get();
      cVar1 = std::istream::get();
      if ((cVar1 == -0x28) && (last == 0xff)) {
        last = std::istream::get();
        uVar3 = std::istream::get();
        pcVar7 = "Error File ended premature";
        while (bVar2 = this->valid, (bool)bVar2 == true) {
          if ((abStack_218[*(long *)(_inFile + -0x18)] & 5) != 0) goto LAB_00103512;
          if (last != 0xff) {
            pcVar7 = "Error expected a marker";
            goto LAB_00103512;
          }
          uVar8 = uVar3 & 0xff;
          if (uVar8 == 0xc0) {
            this->frameType = 0xc0;
            header = this;
            readStartOfFrame(&inFile,this);
LAB_00103346:
            last = std::istream::get();
          }
          else {
            if ((uVar3 & 0xf0) == 0xe0) {
              readAPPN(&inFile,header);
              goto LAB_00103346;
            }
            if ((char)uVar3 == -0x3c) {
              header = this;
              readHuffmanTable(&inFile,this);
              goto LAB_00103346;
            }
            uVar5 = uVar3 & 0xff;
            if (uVar5 == 0xdb) {
              header = this;
              readQuantizationTable(&inFile,this);
              goto LAB_00103346;
            }
            if (uVar5 == 0xdd) {
              header = this;
              readRestartInterval(&inFile,this);
              goto LAB_00103346;
            }
            if (uVar5 == 0xfe) {
LAB_00103317:
              readComment(&inFile,header);
              goto LAB_00103346;
            }
            if (uVar5 == 0xda) {
              readStartOfScan(&inFile,this);
              bVar2 = this->valid;
              break;
            }
            if (((uVar8 == 0xdf) ||
                (header = (Header *)(ulong)(uVar3 & 0xfd), (uVar3 & 0xfd) == 0xdc)) ||
               (header = (Header *)(ulong)(uVar8 - 0xf0), uVar8 - 0xf0 < 0xe)) goto LAB_00103317;
            if ((char)uVar3 == '\x01') goto LAB_00103346;
            if (uVar5 != 0xff) {
              if (uVar5 == 0xcc) {
                pcVar7 = "Error - Arithmetic Coding code not supported\n";
              }
              else if (uVar5 == 0xd8) {
                pcVar7 = "Error -Embedded JPGs not supported\n";
              }
              else {
                if (uVar5 != 0xd9) {
                  if ((uVar3 & 0xf0) == 0xc0) {
                    pcVar7 = "Error - SOF marker not supported: 0x";
                  }
                  else {
                    if ((uVar3 & 0xf8) == 0xd0) {
                      pcVar7 = "Error - RSTN detected before SOS \n";
                      goto LAB_00103615;
                    }
                    pcVar7 = "Error - Unknow marker 0x:";
                  }
                  poVar4 = std::operator<<((ostream *)&std::cout,pcVar7);
                  goto LAB_001035cb;
                }
                pcVar7 = "Error - EOI detected before SOS\n";
              }
LAB_00103615:
              poVar4 = (ostream *)&std::cout;
              goto LAB_0010356b;
            }
          }
          uVar3 = std::istream::get();
        }
        if ((bVar2 & 1) == 0) {
LAB_00103474:
          if ((this->numComponents | 2) == 3) {
            pcVar7 = "Error - using uninitialized quantization talbe\n";
            lVar6 = 0;
            do {
              if ((ulong)this->numComponents * 6 + 6 == lVar6 + 6) goto LAB_00103530;
              bVar2 = (&this->colorComponent[0].quantizationTableID)[lVar6];
              if (this->quantizationTables[bVar2].set == false) goto LAB_00103575;
              if (this->huffmanACTables[bVar2].set == false) {
                pcVar7 = "Error - using uninitialized Huffman AC talbe\n";
                goto LAB_00103575;
              }
              lVar6 = lVar6 + 6;
            } while (this->huffmanDCTables[bVar2].set != false);
            pcVar7 = "Error - using uninitialized Huffman DC talbe\n";
LAB_00103575:
            std::operator<<((ostream *)&std::cout,pcVar7);
            this->valid = false;
            std::ifstream::close();
            goto LAB_001031a9;
          }
          poVar4 = std::operator<<((ostream *)&std::cout,"Error - ");
          poVar4 = std::operator<<(poVar4,this->numComponents);
          pcVar7 = "required color compoenent 1 or 3 \n";
LAB_0010356b:
          std::operator<<(poVar4,pcVar7);
        }
        else {
          bVar2 = std::istream::get();
LAB_001033f8:
          do {
            if ((abStack_218[*(long *)(_inFile + -0x18)] & 5) != 0) {
              pcVar7 = "Error File ended premature";
LAB_00103512:
              poVar4 = std::operator<<((ostream *)&std::cout,pcVar7);
              goto LAB_00103521;
            }
            last = bVar2;
            bVar2 = std::istream::get();
            if (last != 0xff) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (&this->huffmanData,&last);
              goto LAB_001033f8;
            }
            if (bVar2 == 0) {
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                        (&this->huffmanData,&last);
LAB_00103468:
              bVar2 = std::istream::get();
              goto LAB_001033f8;
            }
            if (bVar2 == 0xd9) goto LAB_00103474;
            if ((bVar2 & 0xf8) == 0xd0) goto LAB_00103468;
          } while (bVar2 == 0xff);
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "Error Invalid marker during compressed data scan: 0x");
LAB_001035cb:
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 8;
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) =
               *(uint *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x18) & 0xffffffb5 | 2;
LAB_00103521:
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        this->valid = false;
LAB_00103530:
        std::ifstream::close();
      }
      else {
        this->valid = false;
        std::ifstream::close();
        poVar4 = std::operator<<((ostream *)&std::cout,"not JPEG file");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      goto LAB_001031a9;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"Memory error");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::ifstream::close();
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error opening file");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  this = (Header *)0x0;
LAB_001031a9:
  std::ifstream::~ifstream(&inFile);
  return this;
}

Assistant:

Header* readJPG(const std::string filename) {
	std::ifstream inFile = std::ifstream(filename, std::ios::in | std::ios::binary);
	if (!inFile) {
		std::cout << "Error opening file" <<std::endl;
		return nullptr;
	}

	Header* header = new(std::nothrow) Header;
	if (header == nullptr) {
		std::cout << "Memory error" << std::endl;
		inFile.close();
		return nullptr;
	}

	byte last = inFile.get();
	byte current = inFile.get();

	if (last != 0xff || current != SOI) {
		header->valid = false;
		inFile.close();
		std::cout << "not JPEG file" << std::endl;
		return header;
	}

	last = inFile.get();
	current = inFile.get();
	while (header->valid) {
		if (!inFile) {
			std::cout << "Error File ended premature" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		if (last != 0xff) {
			std::cout << "Error expected a marker" << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}

		// 读取frame类型 只支持baseline
		if (current == SOF0) {
			header->frameType = SOF0;
			readStartOfFrame(inFile, header);
		}  
		/*
			APPn的处理
			An APPn marker may appear anywhere within a JPEG file.
			By convention, applications that create APPn markers store their name at the start of the marker to prevent conflicts with other applications.
		*/
		else if (current >= APP0 && current <= APP15) {
			readAPPN(inFile, header);
		}
		/*
			DQT的处理
			An DQT marker may appear anywhere within a JPEG file.
			one restriction is if a scan requires a quantization table
			it must have been defined in a previous DQT marker
		*/
		else if (current == DQT) {
			readQuantizationTable(inFile, header);
		} 
		/*
			DRI的处理
			Define Restart Interval marker specifies the number of MCUs 
			between restart markers within the compressed data.
			A DRI marker may appear anywhere in the file to define or redefine the restart interval.
			A DRI marker must appear somwhere in the file for a compressed data segment to include restart markers
			
		*/
		else if (current == DRI) {
			readRestartInterval(inFile, header);
		}
		/*
			DHT处理，哈夫曼表
		*/
		else if (current == DHT) {
			readHuffmanTable(inFile, header);
			
		}
		/*
			Start of Scan

		*/
		else if (current == SOS) {
			readStartOfScan(inFile, header);
			break;
		} //skip
		else if (current == COM){
			readComment(inFile, header);
		} //unnecessary, skip
		else if ((current >= JPG0 && current <= JPG13) || current == DNL || current == DHP || current == EXP) {
			readComment(inFile, header);
		}
		else if (current == TEM) {
			//TEM has no size
		}
		/*
			FF may be used as a fill character before the start of any marker
			just ignore
		*/
		else if (current == 0xFF) {
			current = inFile.get();
			continue;
		} 
		else if (current == SOI) {
			std::cout << "Error -Embedded JPGs not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		} 
		else if (current == EOI) {
			std::cout << "Error - EOI detected before SOS\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current == DAC) {
			std::cout << "Error - Arithmetic Coding code not supported\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= SOF0 && current <= SOF15) {
			std::cout << "Error - SOF marker not supported: 0x" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		else if (current >= RST0 && current <= RST7) {
			std::cout << "Error - RSTN detected before SOS \n";
			header->valid = false;
			inFile.close();
			return header;
		}
		else {
			std::cout << "Error - Unknow marker 0x:" << std::hex << (uint)current << std::dec << std::endl;
			header->valid = false;
			inFile.close();
			return header;
		}
		last = inFile.get();
		current = inFile.get();
	}

	/*
		after SOS
		压缩数据的处理
		FF00代表00
		FFFF 多个FF的话，只当做一个FF
		会遇到RST, DNL, EOI
	*/
	if (header->valid) {
		current = inFile.get();
		//read compressed image data
		while (true) {
			if (!inFile) {
				std::cout << "Error File ended premature" << std::endl;
				header->valid = false;
				inFile.close();
				return header;
			}
			last = current;
			current = inFile.get();
			//marker or FF
			if (last == 0xFF) {
				//end of image
				if (current == EOI) {
					break;
				} 
				// 0xFF00 means FF
				else if (current == 0x00) {
					header->huffmanData.push_back(last);
					current = inFile.get();
				}
				//restart marker
				else if (current >= RST0 && current <= RST7) {
					current = inFile.get();
				}
				//ignore multiple 0xFF
				else if (current == 0xFF) {
					// do nothing, one FF will be ignored.
					continue;
				}
				else {
					std::cout << "Error Invalid marker during compressed data scan: 0x" << std::hex << (uint)current << std::dec << std::endl;
					header->valid = false;
					inFile.close();
					return header;
				}
			}
			else {
				header->huffmanData.push_back(last);
			}
		}
	}

	//invalid header info
	if (header->numComponents != 1 && header->numComponents != 3) {
		std::cout << "Error - " << header->numComponents << "required color compoenent 1 or 3 \n";
		header->valid = false;
		inFile.close();
		return header;
	}

	for (uint i = 0; i < header->numComponents; i++) {
		if (header->quantizationTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized quantization talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanACTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman AC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
		if (header->huffmanDCTables[header->colorComponent[i].quantizationTableID].set == false) {
			std::cout << "Error - using uninitialized Huffman DC talbe\n";
			header->valid = false;
			inFile.close();
			return header;
		}
	}
	inFile.close();
	return header;
}